

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall
draco::ObjEncoder::EncodeToBuffer(ObjEncoder *this,Mesh *mesh,EncoderBuffer *out_buffer)

{
  bool bVar1;
  EncoderBuffer *in_RDX;
  Mesh *in_RSI;
  ObjEncoder *in_RDI;
  
  in_RDI->in_mesh_ = in_RSI;
  bVar1 = EncodeToBuffer(in_RDI,&in_RSI->super_PointCloud,in_RDX);
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeToBuffer(const Mesh &mesh, EncoderBuffer *out_buffer) {
  in_mesh_ = &mesh;
  return EncodeToBuffer(static_cast<const PointCloud &>(mesh), out_buffer);
}